

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyPtr.h
# Opt level: O0

CopyPtr<slang::SVUnion> * __thiscall
slang::CopyPtr<slang::SVUnion>::operator=
          (CopyPtr<slang::SVUnion> *this,CopyPtr<slang::SVUnion> *other)

{
  SVUnion *pSVar1;
  CopyPtr<slang::SVUnion> *in_RSI;
  CopyPtr<slang::SVUnion> *in_RDI;
  void **in_stack_ffffffffffffffc8;
  SVUnion **in_stack_ffffffffffffffd0;
  
  if (in_RDI != in_RSI) {
    if (in_RDI->ptr != (SVUnion *)0x0) {
      SVUnion::~SVUnion((SVUnion *)0x248fcc);
      operator_delete(in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    }
    pSVar1 = std::exchange<slang::SVUnion*,decltype(nullptr)>
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_RDI->ptr = pSVar1;
  }
  return in_RDI;
}

Assistant:

CopyPtr& operator=(CopyPtr&& other) noexcept {
        if (this != &other) {
            delete ptr;
            ptr = std::exchange(other.ptr, nullptr);
        }
        return *this;
    }